

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::Server::handle_file_request(Server *this,Request *req,Response *res,bool head)

{
  char cVar1;
  size_t sVar2;
  bool bVar3;
  mmap *pmVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  int iVar6;
  long *plVar7;
  byte bVar8;
  undefined7 in_register_00000009;
  size_type *psVar9;
  ulong uVar10;
  __node_base *p_Var11;
  string *psVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar13;
  pointer pMVar14;
  ulong uVar15;
  ulong uVar16;
  string sub_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  shared_ptr<httplib::detail::mmap> mm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  FileStat stat;
  uint local_1f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  long local_1b0;
  mmap *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  undefined4 local_194;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  Server *local_170;
  _Any_data local_168;
  code *local_158;
  code *pcStack_150;
  string local_148;
  _Any_data *local_128;
  Request *local_120;
  function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *local_118;
  function<void_(bool)> *local_110;
  string *local_108;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_100;
  string *local_f8;
  pointer local_f0;
  _Any_data local_e8;
  code *local_d8;
  undefined8 uStack_d0;
  stat local_c8;
  int local_38;
  
  local_194 = (undefined4)CONCAT71(in_register_00000009,head);
  pMVar14 = (this->base_dirs_).
            super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_f0 = (this->base_dirs_).
             super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar14 != local_f0) {
    psVar12 = &req->path;
    local_100 = &this->file_extension_and_mimetype_map_;
    local_108 = &this->default_file_mimetype_;
    local_118 = &res->content_provider_;
    local_110 = &res->content_provider_resource_releaser_;
    local_128 = (_Any_data *)&this->file_request_handler_;
    local_1f4 = (uint)local_128;
    local_170 = this;
    local_120 = req;
    local_f8 = psVar12;
    do {
      iVar6 = std::__cxx11::string::compare
                        ((ulong)psVar12,0,(string *)(pMVar14->mount_point)._M_string_length);
      if (iVar6 == 0) {
        std::__cxx11::string::substr((ulong)&local_c8,(ulong)psVar12);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x2896f9);
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_1f0.field_2._M_allocated_capacity = *psVar9;
          local_1f0.field_2._8_8_ = plVar7[3];
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        }
        else {
          local_1f0.field_2._M_allocated_capacity = *psVar9;
          local_1f0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_1f0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((__nlink_t *)local_c8.st_dev != &local_c8.st_nlink) {
          operator_delete((void *)local_c8.st_dev,local_c8.st_nlink + 1);
        }
        if (local_1f0._M_string_length == 0) {
          uVar13 = 0;
LAB_001714cf:
          if (uVar13 < local_1f0._M_string_length) {
            local_1b0 = 0;
            do {
              uVar10 = uVar13 + 1;
              uVar15 = uVar13;
              if (uVar13 + 1 < local_1f0._M_string_length) {
                uVar10 = local_1f0._M_string_length;
              }
              do {
                cVar1 = local_1f0._M_dataplus._M_p[uVar15];
                if (cVar1 == '\0') goto LAB_001716c6;
                uVar16 = uVar15;
                if (cVar1 == '/') break;
                if (cVar1 == '\\') goto LAB_001716c6;
                uVar15 = uVar15 + 1;
                uVar16 = uVar10;
              } while (uVar15 < local_1f0._M_string_length);
              iVar6 = std::__cxx11::string::compare
                                ((ulong)&local_1f0,uVar13,(char *)(uVar16 - uVar13));
              if (iVar6 != 0) {
                iVar6 = std::__cxx11::string::compare
                                  ((ulong)&local_1f0,uVar13,(char *)(uVar16 - uVar13));
                if (iVar6 == 0) {
                  if (local_1b0 == 0) {
LAB_001716c6:
                    bVar3 = true;
                    goto LAB_00171925;
                  }
                  local_1b0 = local_1b0 + -1;
                }
                else {
                  local_1b0 = local_1b0 + 1;
                }
              }
              if (uVar16 < local_1f0._M_string_length) {
                while (local_1f0._M_dataplus._M_p[uVar16] == '/') {
                  uVar16 = uVar16 + 1;
                  if (local_1f0._M_string_length == uVar16) goto LAB_001715a0;
                }
              }
              uVar13 = uVar16;
            } while (uVar16 < local_1f0._M_string_length);
          }
        }
        else {
          uVar13 = 0;
          do {
            if (local_1f0._M_dataplus._M_p[uVar13] != '/') goto LAB_001714cf;
            uVar13 = uVar13 + 1;
          } while (local_1f0._M_string_length != uVar13);
        }
LAB_001715a0:
        std::operator+(&local_190,&pMVar14->base_dir,&local_1f0);
        if (local_190._M_dataplus._M_p[local_190._M_string_length - 1] == '/') {
          std::__cxx11::string::append((char *)&local_190);
        }
        local_38 = 0xffffffff;
        local_38 = ::stat(local_190._M_dataplus._M_p,&local_c8);
        if ((local_c8.st_mode & 0xf000) == 0x4000 && -1 < local_38) {
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d0,local_1f0._M_dataplus._M_p,
                     local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
          std::__cxx11::string::append((char *)&local_1d0);
          Response::set_redirect(res,&local_1d0,0x12d);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          local_1f4 = 1;
LAB_00171907:
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if ((local_c8.st_mode & 0xf000) == 0x8000 && -1 < local_38) {
            p_Var11 = &(pMVar14->headers)._M_h._M_before_begin;
            while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
              Response::set_header(res,(string *)(p_Var11 + 1),(string *)(p_Var11 + 5));
            }
            local_1d0._M_dataplus._M_p = local_190._M_dataplus._M_p;
            local_1a8 = (mmap *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<httplib::detail::mmap,std::allocator<httplib::detail::mmap>,char_const*>
                      (&local_1a0,&local_1a8,(allocator<httplib::detail::mmap> *)&local_148,
                       (char **)&local_1d0);
            bVar8 = local_1a8->addr_ != (void *)0x0 | local_1a8->is_open_empty_file;
            local_1f4 = (uint)bVar8;
            if (bVar8 != 0) {
              sVar2 = local_1a8->size_;
              detail::find_content_type(&local_148,&local_190,local_100,local_108);
              _Var5._M_pi = local_1a0._M_pi;
              pmVar4 = local_1a8;
              if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_1a0._M_pi)->_M_use_count = (local_1a0._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_1a0._M_pi)->_M_use_count = (local_1a0._M_pi)->_M_use_count + 1;
                }
              }
              local_158 = (code *)0x0;
              pcStack_150 = (code *)0x0;
              local_168._M_unused._M_object = (void *)0x0;
              local_168._8_8_ = 0;
              local_168._M_unused._M_object = operator_new(0x10);
              *(mmap **)local_168._M_unused._0_8_ = pmVar4;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)local_168._M_unused._0_8_ + 8) = _Var5._M_pi;
              pcStack_150 = detail::std::
                            _Function_handler<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/server/httplib.h:6899:15)>
                            ::_M_invoke;
              local_158 = detail::std::
                          _Function_handler<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/server/httplib.h:6899:15)>
                          ::_M_manager;
              local_e8._M_unused._M_object = (void *)0x0;
              local_e8._8_8_ = 0;
              local_d8 = (code *)0x0;
              uStack_d0 = 0;
              local_1d0.field_2._M_allocated_capacity = 0x2d746e65746e6f43;
              local_1d0.field_2._8_4_ = 0x65707954;
              local_1d0._M_string_length = 0xc;
              local_1d0.field_2._M_local_buf[0xc] = '\0';
              local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
              Response::set_header(res,&local_1d0,&local_148);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                operator_delete(local_1d0._M_dataplus._M_p,
                                local_1d0.field_2._M_allocated_capacity + 1);
              }
              res->content_length_ = sVar2;
              if (sVar2 != 0) {
                detail::std::function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)>::
                operator=(local_118,
                          (function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *)
                          &local_168);
              }
              detail::std::function<void_(bool)>::operator=
                        (local_110,(function<void_(bool)> *)&local_e8);
              res->is_chunked_content_provider_ = false;
              if (local_d8 != (code *)0x0) {
                (*local_d8)(&local_e8,&local_e8,__destroy_functor);
              }
              if (local_158 != (code *)0x0) {
                (*local_158)(&local_168,&local_168,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p,
                                local_148.field_2._M_allocated_capacity + 1);
              }
              if (((char)local_194 == '\0') &&
                 ((local_170->file_request_handler_).super__Function_base._M_manager !=
                  (_Manager_type)0x0)) {
                (*(local_170->file_request_handler_)._M_invoker)(local_128,local_120,res);
              }
            }
            if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              detail::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._M_pi);
            }
            goto LAB_00171907;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
LAB_00171925:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        psVar12 = local_f8;
        if (!bVar3) goto LAB_00171962;
      }
      pMVar14 = pMVar14 + 1;
    } while (pMVar14 != local_f0);
  }
  local_1f4._0_1_ = 0;
LAB_00171962:
  return (bool)((byte)local_1f4 & 1);
}

Assistant:

inline bool Server::handle_file_request(const Request &req, Response &res,
                                        bool head) {
  for (const auto &entry : base_dirs_) {
    // Prefix match
    if (!req.path.compare(0, entry.mount_point.size(), entry.mount_point)) {
      std::string sub_path = "/" + req.path.substr(entry.mount_point.size());
      if (detail::is_valid_path(sub_path)) {
        auto path = entry.base_dir + sub_path;
        if (path.back() == '/') { path += "index.html"; }

        detail::FileStat stat(path);

        if (stat.is_dir()) {
          res.set_redirect(sub_path + "/", StatusCode::MovedPermanently_301);
          return true;
        }

        if (stat.is_file()) {
          for (const auto &kv : entry.headers) {
            res.set_header(kv.first, kv.second);
          }

          auto mm = std::make_shared<detail::mmap>(path.c_str());
          if (!mm->is_open()) { return false; }

          res.set_content_provider(
              mm->size(),
              detail::find_content_type(path, file_extension_and_mimetype_map_,
                                        default_file_mimetype_),
              [mm](size_t offset, size_t length, DataSink &sink) -> bool {
                sink.write(mm->data() + offset, length);
                return true;
              });

          if (!head && file_request_handler_) {
            file_request_handler_(req, res);
          }

          return true;
        }
      }
    }
  }
  return false;
}